

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O0

string * efsw::Platform::FileSystem::getCurrentWorkingDirectory_abi_cxx11_(void)

{
  char *pcVar1;
  string *in_RDI;
  allocator local_1021;
  char *local_1020;
  char *result;
  char dir [4097];
  
  pcVar1 = getcwd((char *)&result,0x1001);
  local_1020 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string(in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar1,&local_1021);
    std::allocator<char>::~allocator((allocator<char> *)&local_1021);
  }
  return in_RDI;
}

Assistant:

std::string FileSystem::getCurrentWorkingDirectory() {
	char dir[PATH_MAX + 1];
	char* result = getcwd( dir, PATH_MAX + 1 );
	return result != NULL ? std::string( result ) : std::string();
}